

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

void __thiscall
icu_63::CollationIterator::appendCEsFromCE32
          (CollationIterator *this,CollationData *d,UChar32 c,uint32_t ce32,UBool forward,
          UErrorCode *errorCode)

{
  uint32_t ce32_00;
  int iVar1;
  UChar *pUVar2;
  int64_t *piVar3;
  long *plVar4;
  UBool UVar5;
  uint uVar6;
  int iVar7;
  UChar32 c_00;
  ulong uVar8;
  int64_t iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint32_t *puVar13;
  
  do {
    uVar10 = ce32;
    if ((~uVar10 & 0xc0) != 0) {
      uVar8 = Collation::ceFromSimpleCE32(uVar10);
      goto LAB_0023ed00;
    }
    uVar6 = uVar10 >> 8;
    switch(uVar10 & 0xf) {
    default:
      if (U_ZERO_ERROR < *errorCode) {
        return;
      }
      *errorCode = U_INTERNAL_PROGRAM_ERROR;
      return;
    case 1:
      uVar8 = (ulong)(uVar10 & 0xffffff00) << 0x20 | 0x5000500;
      goto LAB_0023ed00;
    case 2:
      uVar8 = (ulong)(uVar10 & 0xffffff00);
      goto LAB_0023ed00;
    case 4:
      UVar5 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,2,errorCode);
      if (UVar5 == '\0') {
        return;
      }
      iVar7 = (this->ceBuffer).length;
      plVar4 = (this->ceBuffer).buffer.ptr;
      plVar4[iVar7] = (CONCAT44(uVar10,uVar6) & 0xff0000000000ff00) + 0x5000000;
      plVar4[(long)iVar7 + 1] = (ulong)((uVar10 & 0xff00) << 0x10 | 0x500);
      (this->ceBuffer).length = iVar7 + 2;
      return;
    case 5:
      puVar13 = d->ce32s;
      UVar5 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,uVar6 & 0x1f,errorCode);
      if (UVar5 == '\0') {
        return;
      }
      puVar13 = puVar13 + (uVar10 >> 0xd);
      uVar10 = (uVar6 & 0x1f) + 1;
      do {
        ce32_00 = *puVar13;
        puVar13 = puVar13 + 1;
        iVar9 = Collation::ceFromCE32(ce32_00);
        iVar7 = (this->ceBuffer).length;
        (this->ceBuffer).length = iVar7 + 1;
        (this->ceBuffer).buffer.ptr[iVar7] = iVar9;
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
      return;
    case 6:
      piVar3 = d->ces;
      UVar5 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,uVar6 & 0x1f,errorCode);
      if (UVar5 == '\0') {
        return;
      }
      iVar7 = (this->ceBuffer).length;
      plVar4 = (this->ceBuffer).buffer.ptr;
      uVar6 = (uVar6 & 0x1f) + 1;
      lVar11 = 0;
      do {
        plVar4[iVar7 + lVar11] = piVar3[(ulong)(uVar10 >> 0xd) + lVar11];
        lVar11 = lVar11 + 1;
        uVar6 = uVar6 - 1;
      } while (1 < uVar6);
      (this->ceBuffer).length = iVar7 + (int)lVar11;
      return;
    case 7:
      ce32 = (*(this->super_UObject)._vptr_UObject[0xf])(this,(ulong)uVar10,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        return;
      }
      if (ce32 == 0xc0) {
        d = this->data->base;
        ce32 = CollationData::getCE32(d,c);
      }
      break;
    case 8:
      if (forward != '\0') {
        (*(this->super_UObject)._vptr_UObject[0xd])(this,1,errorCode);
      }
      ce32 = getCE32FromPrefix(this,d,uVar10,errorCode);
      if (forward != '\0') {
        (*(this->super_UObject)._vptr_UObject[0xc])(this,1,errorCode);
      }
      break;
    case 9:
      pUVar2 = d->contexts;
      uVar8 = (ulong)(uVar10 >> 0xd);
      ce32 = CONCAT22(pUVar2[uVar8],pUVar2[uVar8 + 1]);
      if (forward != '\0') {
        if ((this->skipped == (SkippedState *)0x0) && (this->numCpFwd < 0)) {
          c_00 = (*(this->super_UObject)._vptr_UObject[6])(this,errorCode);
          if (c_00 < 0) break;
          if (((uVar10 >> 9 & 1) != 0) && (UVar5 = CollationFCD::mayHaveLccc(c_00), UVar5 == '\0'))
          {
            (*(this->super_UObject)._vptr_UObject[0xd])(this,1,errorCode);
            break;
          }
        }
        else {
          c_00 = nextSkippedCodePoint(this,errorCode);
          if (c_00 < 0) break;
          if (((uVar10 >> 9 & 1) != 0) && (UVar5 = CollationFCD::mayHaveLccc(c_00), UVar5 == '\0'))
          {
            backwardNumSkipped(this,1,errorCode);
            break;
          }
        }
        ce32 = nextCE32FromContraction(this,d,uVar10,pUVar2 + uVar8 + 2,ce32,c_00,errorCode);
        if (ce32 == 1) {
          return;
        }
        break;
      }
      break;
    case 10:
      if (this->isNumeric != '\0') {
        appendNumericCEs(this,uVar10,forward,errorCode);
        return;
      }
      ce32 = d->ce32s[uVar10 >> 0xd];
      break;
    case 0xb:
      if ((forward != '\0') &&
         (iVar7 = (*(this->super_UObject)._vptr_UObject[10])(this), (char)iVar7 != '\0')) {
        uVar8 = 0x101000100;
        goto LAB_0023ed00;
      }
      ce32 = *d->ce32s;
      break;
    case 0xc:
      puVar13 = d->jamoCE32s;
      iVar7 = c - 0xac00;
      iVar12 = iVar7 % 0x1c;
      lVar11 = (long)(int)((long)((ulong)(uint)((int)((long)iVar7 / 0x1c) >> 0x1f) << 0x20 |
                                 (long)iVar7 / 0x1c & 0xffffffffU) % 0x15);
      if ((uVar10 >> 8 & 1) != 0) {
        UVar5 = CEBuffer::ensureAppendCapacity(&this->ceBuffer,3 - (uint)(iVar12 == 0),errorCode);
        if (UVar5 == '\0') {
          return;
        }
        iVar1 = (this->ceBuffer).length;
        iVar9 = Collation::ceFromCE32(puVar13[iVar7 / 0x24c]);
        (this->ceBuffer).buffer.ptr[iVar1] = iVar9;
        iVar7 = (this->ceBuffer).length;
        iVar9 = Collation::ceFromCE32(puVar13[lVar11 + 0x13]);
        (this->ceBuffer).buffer.ptr[(long)iVar7 + 1] = iVar9;
        (this->ceBuffer).length = (this->ceBuffer).length + 2;
        if (iVar12 == 0) {
          return;
        }
        iVar9 = Collation::ceFromCE32(puVar13[(long)iVar12 + 0x27]);
        iVar7 = (this->ceBuffer).length;
        (this->ceBuffer).length = iVar7 + 1;
        (this->ceBuffer).buffer.ptr[iVar7] = iVar9;
        return;
      }
      appendCEsFromCE32(this,d,-1,puVar13[iVar7 / 0x24c],forward,errorCode);
      appendCEsFromCE32(this,d,-1,puVar13[lVar11 + 0x13],forward,errorCode);
      if (iVar12 == 0) {
        return;
      }
      c = 0xffffffff;
      ce32 = puVar13[(long)iVar12 + 0x27];
      break;
    case 0xd:
      uVar6 = (*(this->super_UObject)._vptr_UObject[9])(this);
      ce32 = 0xffffffff;
      if ((uVar6 & 0xfc00) == 0xdc00) {
        c = c * 0x400 + (uVar6 & 0xffff) + 0xfca02400;
        ce32 = 0xffffffff;
        if (((uVar10 & 0x300) != 0) &&
           (((uVar10 & 0x300) == 0x100 ||
            (ce32 = CollationData::getCE32FromSupplementary(d,c), ce32 == 0xc0)))) {
          d = d->base;
          ce32 = CollationData::getCE32FromSupplementary(d,c);
        }
      }
      break;
    case 0xe:
      uVar8 = CollationData::getCEFromOffsetCE32(d,c,uVar10);
      goto LAB_0023ed00;
    case 0xf:
      if ((c & 0xfffff800U) != 0xd800) goto LAB_0023ed27;
      iVar7 = (*(this->super_UObject)._vptr_UObject[0xb])(this);
      ce32 = 0xfffd0505;
      if ((char)iVar7 == '\0') {
LAB_0023ed27:
        uVar8 = Collation::unassignedCEFromCodePoint(c);
LAB_0023ed00:
        CEBuffer::append(&this->ceBuffer,uVar8,errorCode);
        return;
      }
    }
  } while( true );
}

Assistant:

void
CollationIterator::appendCEsFromCE32(const CollationData *d, UChar32 c, uint32_t ce32,
                                     UBool forward, UErrorCode &errorCode) {
    while(Collation::isSpecialCE32(ce32)) {
        switch(Collation::tagFromCE32(ce32)) {
        case Collation::FALLBACK_TAG:
        case Collation::RESERVED_TAG_3:
            if(U_SUCCESS(errorCode)) { errorCode = U_INTERNAL_PROGRAM_ERROR; }
            return;
        case Collation::LONG_PRIMARY_TAG:
            ceBuffer.append(Collation::ceFromLongPrimaryCE32(ce32), errorCode);
            return;
        case Collation::LONG_SECONDARY_TAG:
            ceBuffer.append(Collation::ceFromLongSecondaryCE32(ce32), errorCode);
            return;
        case Collation::LATIN_EXPANSION_TAG:
            if(ceBuffer.ensureAppendCapacity(2, errorCode)) {
                ceBuffer.set(ceBuffer.length, Collation::latinCE0FromCE32(ce32));
                ceBuffer.set(ceBuffer.length + 1, Collation::latinCE1FromCE32(ce32));
                ceBuffer.length += 2;
            }
            return;
        case Collation::EXPANSION32_TAG: {
            const uint32_t *ce32s = d->ce32s + Collation::indexFromCE32(ce32);
            int32_t length = Collation::lengthFromCE32(ce32);
            if(ceBuffer.ensureAppendCapacity(length, errorCode)) {
                do {
                    ceBuffer.appendUnsafe(Collation::ceFromCE32(*ce32s++));
                } while(--length > 0);
            }
            return;
        }
        case Collation::EXPANSION_TAG: {
            const int64_t *ces = d->ces + Collation::indexFromCE32(ce32);
            int32_t length = Collation::lengthFromCE32(ce32);
            if(ceBuffer.ensureAppendCapacity(length, errorCode)) {
                do {
                    ceBuffer.appendUnsafe(*ces++);
                } while(--length > 0);
            }
            return;
        }
        case Collation::BUILDER_DATA_TAG:
            ce32 = getCE32FromBuilderData(ce32, errorCode);
            if(U_FAILURE(errorCode)) { return; }
            if(ce32 == Collation::FALLBACK_CE32) {
                d = data->base;
                ce32 = d->getCE32(c);
            }
            break;
        case Collation::PREFIX_TAG:
            if(forward) { backwardNumCodePoints(1, errorCode); }
            ce32 = getCE32FromPrefix(d, ce32, errorCode);
            if(forward) { forwardNumCodePoints(1, errorCode); }
            break;
        case Collation::CONTRACTION_TAG: {
            const UChar *p = d->contexts + Collation::indexFromCE32(ce32);
            uint32_t defaultCE32 = CollationData::readCE32(p);  // Default if no suffix match.
            if(!forward) {
                // Backward contractions are handled by previousCEUnsafe().
                // c has contractions but they were not found.
                ce32 = defaultCE32;
                break;
            }
            UChar32 nextCp;
            if(skipped == NULL && numCpFwd < 0) {
                // Some portion of nextCE32FromContraction() pulled out here as an ASCII fast path,
                // avoiding the function call and the nextSkippedCodePoint() overhead.
                nextCp = nextCodePoint(errorCode);
                if(nextCp < 0) {
                    // No more text.
                    ce32 = defaultCE32;
                    break;
                } else if((ce32 & Collation::CONTRACT_NEXT_CCC) != 0 &&
                        !CollationFCD::mayHaveLccc(nextCp)) {
                    // All contraction suffixes start with characters with lccc!=0
                    // but the next code point has lccc==0.
                    backwardNumCodePoints(1, errorCode);
                    ce32 = defaultCE32;
                    break;
                }
            } else {
                nextCp = nextSkippedCodePoint(errorCode);
                if(nextCp < 0) {
                    // No more text.
                    ce32 = defaultCE32;
                    break;
                } else if((ce32 & Collation::CONTRACT_NEXT_CCC) != 0 &&
                        !CollationFCD::mayHaveLccc(nextCp)) {
                    // All contraction suffixes start with characters with lccc!=0
                    // but the next code point has lccc==0.
                    backwardNumSkipped(1, errorCode);
                    ce32 = defaultCE32;
                    break;
                }
            }
            ce32 = nextCE32FromContraction(d, ce32, p + 2, defaultCE32, nextCp, errorCode);
            if(ce32 == Collation::NO_CE32) {
                // CEs from a discontiguous contraction plus the skipped combining marks
                // have been appended already.
                return;
            }
            break;
        }
        case Collation::DIGIT_TAG:
            if(isNumeric) {
                appendNumericCEs(ce32, forward, errorCode);
                return;
            } else {
                // Fetch the non-numeric-collation CE32 and continue.
                ce32 = d->ce32s[Collation::indexFromCE32(ce32)];
                break;
            }
        case Collation::U0000_TAG:
            U_ASSERT(c == 0);
            if(forward && foundNULTerminator()) {
                // Handle NUL-termination. (Not needed in Java.)
                ceBuffer.append(Collation::NO_CE, errorCode);
                return;
            } else {
                // Fetch the normal ce32 for U+0000 and continue.
                ce32 = d->ce32s[0];
                break;
            }
        case Collation::HANGUL_TAG: {
            const uint32_t *jamoCE32s = d->jamoCE32s;
            c -= Hangul::HANGUL_BASE;
            UChar32 t = c % Hangul::JAMO_T_COUNT;
            c /= Hangul::JAMO_T_COUNT;
            UChar32 v = c % Hangul::JAMO_V_COUNT;
            c /= Hangul::JAMO_V_COUNT;
            if((ce32 & Collation::HANGUL_NO_SPECIAL_JAMO) != 0) {
                // None of the Jamo CE32s are isSpecialCE32().
                // Avoid recursive function calls and per-Jamo tests.
                if(ceBuffer.ensureAppendCapacity(t == 0 ? 2 : 3, errorCode)) {
                    ceBuffer.set(ceBuffer.length, Collation::ceFromCE32(jamoCE32s[c]));
                    ceBuffer.set(ceBuffer.length + 1, Collation::ceFromCE32(jamoCE32s[19 + v]));
                    ceBuffer.length += 2;
                    if(t != 0) {
                        ceBuffer.appendUnsafe(Collation::ceFromCE32(jamoCE32s[39 + t]));
                    }
                }
                return;
            } else {
                // We should not need to compute each Jamo code point.
                // In particular, there should be no offset or implicit ce32.
                appendCEsFromCE32(d, U_SENTINEL, jamoCE32s[c], forward, errorCode);
                appendCEsFromCE32(d, U_SENTINEL, jamoCE32s[19 + v], forward, errorCode);
                if(t == 0) { return; }
                // offset 39 = 19 + 21 - 1:
                // 19 = JAMO_L_COUNT
                // 21 = JAMO_T_COUNT
                // -1 = omit t==0
                ce32 = jamoCE32s[39 + t];
                c = U_SENTINEL;
                break;
            }
        }
        case Collation::LEAD_SURROGATE_TAG: {
            U_ASSERT(forward);  // Backward iteration should never see lead surrogate code _unit_ data.
            U_ASSERT(U16_IS_LEAD(c));
            UChar trail;
            if(U16_IS_TRAIL(trail = handleGetTrailSurrogate())) {
                c = U16_GET_SUPPLEMENTARY(c, trail);
                ce32 &= Collation::LEAD_TYPE_MASK;
                if(ce32 == Collation::LEAD_ALL_UNASSIGNED) {
                    ce32 = Collation::UNASSIGNED_CE32;  // unassigned-implicit
                } else if(ce32 == Collation::LEAD_ALL_FALLBACK ||
                        (ce32 = d->getCE32FromSupplementary(c)) == Collation::FALLBACK_CE32) {
                    // fall back to the base data
                    d = d->base;
                    ce32 = d->getCE32FromSupplementary(c);
                }
            } else {
                // c is an unpaired surrogate.
                ce32 = Collation::UNASSIGNED_CE32;
            }
            break;
        }
        case Collation::OFFSET_TAG:
            U_ASSERT(c >= 0);
            ceBuffer.append(d->getCEFromOffsetCE32(c, ce32), errorCode);
            return;
        case Collation::IMPLICIT_TAG:
            U_ASSERT(c >= 0);
            if(U_IS_SURROGATE(c) && forbidSurrogateCodePoints()) {
                ce32 = Collation::FFFD_CE32;
                break;
            } else {
                ceBuffer.append(Collation::unassignedCEFromCodePoint(c), errorCode);
                return;
            }
        }
    }
    ceBuffer.append(Collation::ceFromSimpleCE32(ce32), errorCode);
}